

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_image.cxx
# Opt level: O1

void * __thiscall Fl_PostScript_Graphics_Driver::prepare_rle85(Fl_PostScript_Graphics_Driver *this)

{
  undefined8 *puVar1;
  void *pvVar2;
  
  puVar1 = (undefined8 *)operator_new(0x90);
  puVar1[0x11] = 0;
  pvVar2 = operator_new(0x14);
  *(undefined8 *)((long)pvVar2 + 4) = 0;
  *puVar1 = pvVar2;
  return puVar1;
}

Assistant:

void *Fl_PostScript_Graphics_Driver::prepare_rle85() // prepare to produce RLE+ASCII85-encoded output
{
  struct_rle85 *rle = new struct_rle85;
  rle->count = 0;
  rle->run_length = 0;
  rle->data85 = (struct85*)prepare85();
  return rle;
}